

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__pnm_info(stbi__context *s,int *x,int *y,int *comp)

{
  int iVar1;
  stbi_uc *psVar2;
  stbi_uc *psVar3;
  long in_FS_OFFSET;
  bool bVar4;
  char c;
  stbi_uc local_29;
  
  psVar2 = s->img_buffer_original;
  psVar3 = s->img_buffer_original_end;
  s->img_buffer = psVar2;
  s->img_buffer_end = psVar3;
  if (psVar2 < psVar3) {
LAB_00119b64:
    s->img_buffer = psVar2 + 1;
    bVar4 = *psVar2 != 'P';
    psVar2 = psVar2 + 1;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar2 = s->img_buffer;
      psVar3 = s->img_buffer_end;
      goto LAB_00119b64;
    }
    bVar4 = true;
  }
  if (psVar3 <= psVar2) {
    if (s->read_from_callbacks == 0) goto LAB_00119bb1;
    stbi__refill_buffer(s);
    psVar2 = s->img_buffer;
  }
  psVar3 = psVar2 + 1;
  s->img_buffer = psVar3;
  if (!(bool)(~bVar4 & 0xfd < (byte)(*psVar2 - 0x37))) {
LAB_00119bb1:
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    return 0;
  }
  if (comp != (int *)0x0) {
    *comp = (uint)(*psVar2 == '6') * 2 + 1;
  }
  if (s->img_buffer_end <= psVar3) {
    if (s->read_from_callbacks == 0) {
      local_29 = '\0';
      goto LAB_00119c0a;
    }
    stbi__refill_buffer(s);
    psVar3 = s->img_buffer;
  }
  s->img_buffer = psVar3 + 1;
  local_29 = *psVar3;
LAB_00119c0a:
  stbi__pnm_skip_whitespace(s,(char *)&local_29);
  iVar1 = stbi__pnm_getinteger(s,(char *)&local_29);
  if (x != (int *)0x0) {
    *x = iVar1;
  }
  stbi__pnm_skip_whitespace(s,(char *)&local_29);
  iVar1 = stbi__pnm_getinteger(s,(char *)&local_29);
  if (y != (int *)0x0) {
    *y = iVar1;
  }
  stbi__pnm_skip_whitespace(s,(char *)&local_29);
  iVar1 = stbi__pnm_getinteger(s,(char *)&local_29);
  if (0xff < iVar1) {
    *(char **)(in_FS_OFFSET + -0x10) = "max value > 255";
    return 0;
  }
  return 1;
}

Assistant:

static int      stbi__pnm_info(stbi__context *s, int *x, int *y, int *comp)
{
   int maxv, dummy;
   char c, p, t;

   if (!x) x = &dummy;
   if (!y) y = &dummy;
   if (!comp) comp = &dummy;

   stbi__rewind(s);

   // Get identifier
   p = (char) stbi__get8(s);
   t = (char) stbi__get8(s);
   if (p != 'P' || (t != '5' && t != '6')) {
       stbi__rewind(s);
       return 0;
   }

   *comp = (t == '6') ? 3 : 1;  // '5' is 1-component .pgm; '6' is 3-component .ppm

   c = (char) stbi__get8(s);
   stbi__pnm_skip_whitespace(s, &c);

   *x = stbi__pnm_getinteger(s, &c); // read width
   stbi__pnm_skip_whitespace(s, &c);

   *y = stbi__pnm_getinteger(s, &c); // read height
   stbi__pnm_skip_whitespace(s, &c);

   maxv = stbi__pnm_getinteger(s, &c);  // read max value

   if (maxv > 255)
      return stbi__err("max value > 255", "PPM image not 8-bit");
   else
      return 1;
}